

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall GlobOpt::InsertNoImplicitCallUses(GlobOpt *this,Instr *instr)

{
  int index;
  int iVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  undefined4 *puVar6;
  Instr *this_00;
  PragmaInstr *this_01;
  Type *ppOVar7;
  Opnd *pOVar8;
  int index_00;
  
  if (this->noImplicitCallUsesToInsert == (OpndList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3536,"(noImplicitCallUsesToInsert)","noImplicitCallUsesToInsert");
    if (!bVar4) {
LAB_004511de:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  iVar1 = (this->noImplicitCallUsesToInsert->
          super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>).count;
  if (iVar1 != 0) {
    this_00 = IR::Instr::GetInsertBeforeByteCodeUsesInstr(instr);
    if (0 < iVar1) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      index_00 = 0;
      do {
        this_01 = IR::PragmaInstr::New(NoImplicitCallUses,0,instr->m_func);
        ppOVar7 = JsUtil::
                  List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this->noImplicitCallUsesToInsert,index_00);
        pOVar8 = *ppOVar7;
        if ((this_01->super_Instr).m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar4) goto LAB_004511de;
          *puVar6 = 0;
        }
        pFVar2 = (this_01->super_Instr).m_func;
        if (pOVar8->isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar4) goto LAB_004511de;
          *puVar6 = 0;
        }
        bVar5 = pOVar8->field_0xb;
        if ((bVar5 & 2) != 0) {
          pOVar8 = IR::Opnd::Copy(pOVar8,pFVar2);
          bVar5 = pOVar8->field_0xb;
        }
        pOVar8->field_0xb = bVar5 | 2;
        (this_01->super_Instr).m_src1 = pOVar8;
        IR::Opnd::SetIsJITOptimizedReg(pOVar8,true);
        index = index_00 + 1;
        if (index < iVar1) {
          ppOVar7 = JsUtil::
                    List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item(this->noImplicitCallUsesToInsert,index);
          pOVar8 = *ppOVar7;
          if ((this_01->super_Instr).m_src2 != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src."
                              );
            if (!bVar4) goto LAB_004511de;
            *puVar6 = 0;
          }
          pFVar2 = (this_01->super_Instr).m_func;
          if (pOVar8->isDeleted == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x14,"(!isDeleted)","Using deleted operand");
            if (!bVar4) goto LAB_004511de;
            *puVar6 = 0;
          }
          bVar5 = pOVar8->field_0xb;
          if ((bVar5 & 2) != 0) {
            pOVar8 = IR::Opnd::Copy(pOVar8,pFVar2);
            bVar5 = pOVar8->field_0xb;
          }
          pOVar8->field_0xb = bVar5 | 2;
          (this_01->super_Instr).m_src2 = pOVar8;
          IR::Opnd::SetIsJITOptimizedReg(pOVar8,true);
          index = index_00 + 2;
        }
        index_00 = index;
        IR::Instr::SetByteCodeOffset(&this_01->super_Instr,instr);
        IR::Instr::InsertBefore(this_00,&this_01->super_Instr);
      } while (index_00 < iVar1);
    }
    (this->noImplicitCallUsesToInsert->
    super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>).count = 0;
  }
  return;
}

Assistant:

void
GlobOpt::InsertNoImplicitCallUses(IR::Instr *const instr)
{
    Assert(noImplicitCallUsesToInsert);

    const int n = noImplicitCallUsesToInsert->Count();
    if(n == 0)
    {
        return;
    }

    IR::Instr *const insertBeforeInstr = instr->GetInsertBeforeByteCodeUsesInstr();
    for(int i = 0; i < n;)
    {
        IR::Instr *const noImplicitCallUses = IR::PragmaInstr::New(Js::OpCode::NoImplicitCallUses, 0, instr->m_func);
        noImplicitCallUses->SetSrc1(noImplicitCallUsesToInsert->Item(i));
        noImplicitCallUses->GetSrc1()->SetIsJITOptimizedReg(true);
        ++i;
        if(i < n)
        {
            noImplicitCallUses->SetSrc2(noImplicitCallUsesToInsert->Item(i));
            noImplicitCallUses->GetSrc2()->SetIsJITOptimizedReg(true);
            ++i;
        }
        noImplicitCallUses->SetByteCodeOffset(instr);
        insertBeforeInstr->InsertBefore(noImplicitCallUses);
    }
    noImplicitCallUsesToInsert->Clear();
}